

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::GetKeyPressedAmount(ImGuiKey key,float repeat_delay,float repeat_rate)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiKeyData *pIVar3;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float t;
  ImGuiKeyData *key_data;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  pIVar3 = GetKeyData((ImGuiKey)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  iVar2 = CalcTypematicRepeatAmount
                    (pIVar3->DownDuration - (pIVar1->IO).DeltaTime,pIVar3->DownDuration,in_XMM0_Da,
                     in_XMM1_Da);
  return iVar2;
}

Assistant:

int ImGui::GetKeyPressedAmount(ImGuiKey key, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}